

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<wchar_t>::write_double<long_double>
          (BasicWriter<wchar_t> *this,longdouble value,FormatSpec *spec)

{
  Alignment AVar1;
  wchar_t fill;
  uint uVar2;
  CharPtr pwVar3;
  wchar_t *pwVar4;
  uint uVar5;
  wchar_t wVar6;
  byte bVar7;
  byte code;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  undefined8 *puVar11;
  CharTraits<wchar_t> *this_00;
  long lVar12;
  bool bVar13;
  long local_78;
  ushort uStack_70;
  wchar_t format [10];
  
  code = spec->type_;
  uVar5 = code - 0x41;
  if (uVar5 < 0x27) {
    if ((0x71UL >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_00361f0d;
      goto LAB_00361c18;
    }
    bVar13 = true;
  }
  else {
LAB_00361f0d:
    if (code != 0) {
      internal::report_unknown_type(code,"double");
    }
    code = 0x67;
LAB_00361c18:
    bVar13 = false;
  }
  if (0.0 <= (double)value) {
    if ((spec->flags_ & 1) == 0) {
      bVar7 = 0;
    }
    else {
      bVar7 = 0x2b;
      if ((spec->flags_ & 2) == 0) {
        bVar7 = 0x20;
      }
    }
  }
  else {
    value = -value;
    bVar7 = 0x2d;
  }
  if (NAN(value)) {
    pcVar10 = " nan";
    if (bVar13) {
      pcVar10 = " NAN";
    }
    pcVar8 = " nan";
    if (bVar13) {
      pcVar8 = " NAN";
    }
    pcVar8 = pcVar8 + 1;
    if (bVar7 != 0) {
      pcVar8 = pcVar10;
    }
    uVar9 = (ulong)(bVar7 != 0);
LAB_00361cb2:
    pwVar3 = write_str<char>(this,pcVar8,uVar9 + 3,&spec->super_AlignSpec);
    if (bVar7 != 0) {
      *pwVar3 = (uint)bVar7;
    }
    return;
  }
  local_78 = SUB108(value,0);
  uStack_70 = (ushort)((unkuint10)value >> 0x40);
  if ((~uStack_70 & 0x7fff) == 0 && local_78 == -0x8000000000000000) {
    pcVar10 = " inf";
    if (bVar13) {
      pcVar10 = " INF";
    }
    pcVar8 = " inf";
    if (bVar13) {
      pcVar8 = " INF";
    }
    uVar9 = (ulong)(bVar7 != 0);
    pcVar8 = pcVar8 + 1;
    if (bVar7 != 0) {
      pcVar8 = pcVar10;
    }
    goto LAB_00361cb2;
  }
  puVar11 = *(undefined8 **)(this + 8);
  lVar12 = puVar11[2];
  uVar5 = (spec->super_AlignSpec).super_WidthSpec.width_;
  if (bVar7 != 0) {
    if ((ulong)puVar11[3] < (ulong)(uVar5 + (uVar5 == 0)) + lVar12) {
      (**(code **)*puVar11)();
    }
    bVar13 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar13) {
      uVar5 = 0;
    }
    lVar12 = lVar12 + 1;
  }
  format[0] = L'%';
  if ((spec->flags_ & 8) == 0) {
    pwVar4 = format + 1;
  }
  else {
    pwVar4 = format + 2;
    format[1] = L'#';
  }
  AVar1 = (spec->super_AlignSpec).align_;
  if (AVar1 != ALIGN_CENTER) {
    if (AVar1 == ALIGN_LEFT) {
      *pwVar4 = L'-';
      pwVar4 = pwVar4 + 1;
    }
    if (uVar5 != 0) {
      *pwVar4 = L'*';
      pwVar4 = pwVar4 + 1;
      goto LAB_00361d7a;
    }
  }
  uVar5 = 0;
LAB_00361d7a:
  uVar2 = spec->precision_;
  if (-1 < (int)uVar2) {
    pwVar4[0] = L'.';
    pwVar4[1] = L'*';
    pwVar4 = pwVar4 + 2;
  }
  *pwVar4 = L'L';
  pwVar4[1] = (uint)code;
  pwVar4[2] = L'\0';
  fill = (spec->super_AlignSpec).super_WidthSpec.fill_;
  do {
    this_00 = (CharTraits<wchar_t> *)(*(long *)(*(long *)(this + 8) + 8) + lVar12 * 4);
    uVar2 = internal::CharTraits<wchar_t>::format_float<long_double>
                      (this_00,(wchar_t *)(*(long *)(*(long *)(this + 8) + 0x18) - lVar12),
                       (size_t)format,(wchar_t *)(ulong)uVar5,uVar2,(int)this,value);
    if ((int)uVar2 < 0) {
      puVar11 = *(undefined8 **)(this + 8);
      if (puVar11[3] != -1) {
        uVar9 = puVar11[3] + 1;
        goto LAB_00361e24;
      }
    }
    else {
      puVar11 = *(undefined8 **)(this + 8);
      if ((ulong)uVar2 + lVar12 < (ulong)puVar11[3]) {
        AVar1 = (spec->super_AlignSpec).align_;
        if (bVar7 == 0) {
          bVar7 = 0;
        }
        else {
          if (((AVar1 != ALIGN_RIGHT) && (AVar1 != ALIGN_DEFAULT)) ||
             (wVar6 = fill, *(int *)this_00 != 0x20)) {
            wVar6 = (wchar_t)bVar7;
            bVar7 = 0;
          }
          *(wchar_t *)(this_00 + -4) = wVar6;
          uVar2 = uVar2 + 1;
        }
        if (AVar1 == ALIGN_CENTER) {
          uVar5 = (spec->super_AlignSpec).super_WidthSpec.width_;
          if (uVar2 < uVar5) {
            pwVar3 = grow_buffer(this,(ulong)uVar5);
            memmove(pwVar3 + (uVar5 - uVar2 >> 1),pwVar3,(ulong)uVar2 * 4);
            fill_padding(pwVar3,(spec->super_AlignSpec).super_WidthSpec.width_,(ulong)uVar2,fill);
            return;
          }
        }
        if ((bVar7 != 0) || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
          for (; *(wchar_t *)this_00 == L' '; this_00 = this_00 + 4) {
            *(wchar_t *)this_00 = fill;
          }
          if (bVar7 != 0) {
            *(uint *)(this_00 + -4) = (uint)bVar7;
          }
        }
        grow_buffer(this,(ulong)uVar2);
        return;
      }
      uVar9 = (ulong)uVar2 + lVar12 + 1;
      if ((ulong)puVar11[3] < uVar9) {
LAB_00361e24:
        (**(code **)*puVar11)(puVar11,uVar9);
      }
    }
    uVar2 = spec->precision_;
  } while( true );
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}